

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ForStmt *stmt)

{
  undefined1 *puVar1;
  pointer pcVar2;
  undefined1 this_00 [8];
  pointer begin;
  ostream *poVar3;
  char *pcVar4;
  string *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view sVar5;
  basic_string_view<char> bVar6;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_d0 [8];
  string var_decl_str;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  Stream *local_a0;
  string local_98;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_decl;
  shared_ptr<kratos::IterVar> iter;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  
  if (this->generator_->debug == true) {
    (stmt->super_Stmt).super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  std::__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &(stmt->iter_).super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>);
  var_decl.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  var_decl.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (*(char *)&var_decl.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x14]._M_dataplus._M_p == '\x01')
  {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
               (char (*) [7])"genvar");
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
               (char (*) [4])0x21f3ae);
    if (var_decl.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[7].field_2._M_local_buf[0] == '\0') {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
                 (char (*) [9])"unsigned");
    }
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IterVar,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_a0 = &this->stream_;
  Stream::var_str_abi_cxx11_
            ((string *)local_d0,&this->stream_,
             (Var *)iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  begin = var_decl.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  this_00 = auStack_78;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount," ",
             (allocator<char> *)&local_98);
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)local_d0,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )&iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,in_R8);
  std::__cxx11::string::~string
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar5 = indent(this);
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar5._M_str,sVar5._M_len);
  poVar3 = std::operator<<(poVar3,"for (");
  poVar3 = std::operator<<(poVar3,(string *)local_d0);
  std::operator<<(poVar3," = ");
  local_98._M_dataplus._M_p = (pointer)stmt->start_;
  bVar6 = fmt::v7::to_string_view<char,_0>("{0}");
  format_str.data_ = (char *)bVar6.size_;
  format_str.size_ = 3;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (detail *)bVar6.data_,format_str,args);
  poVar3 = std::operator<<((ostream *)puVar1,
                           (string *)
                           &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  poVar3 = std::operator<<(poVar3,"; ");
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IterVar,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (var_decl_str.field_2._M_local_buf + 8),
             (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Stream::var_str_abi_cxx11_(&local_98,local_a0,(Var *)var_decl_str.field_2._8_8_);
  poVar3 = std::operator<<(poVar3,(string *)&local_98);
  pcVar4 = " > ";
  if (stmt->start_ < stmt->end_) {
    pcVar4 = " < ";
  }
  std::operator<<(poVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__cxx11::string::~string
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_98._M_dataplus._M_p = (pointer)stmt->end_;
  bVar6 = fmt::v7::to_string_view<char,_0>("{0}");
  format_str_00.data_ = (char *)bVar6.size_;
  format_str_00.size_ = 3;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (detail *)bVar6.data_,format_str_00,args_00);
  poVar3 = std::operator<<((ostream *)puVar1,
                           (string *)
                           &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  poVar3 = std::operator<<(poVar3,"; ");
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IterVar,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (var_decl_str.field_2._M_local_buf + 8),
             (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Stream::var_str_abi_cxx11_(&local_98,local_a0,(Var *)var_decl_str.field_2._8_8_);
  poVar3 = std::operator<<(poVar3,(string *)&local_98);
  pcVar4 = " -= ";
  if (0 < stmt->step_) {
    pcVar4 = " += ";
  }
  std::operator<<(poVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__cxx11::string::~string
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pcVar2 = (pointer)stmt->step_;
  local_98._M_dataplus._M_p = (pointer)-(long)pcVar2;
  if (0 < (long)pcVar2) {
    local_98._M_dataplus._M_p = pcVar2;
  }
  bVar6 = fmt::v7::to_string_view<char,_0>("{0}");
  format_str_01.data_ = (char *)bVar6.size_;
  format_str_01.size_ = 3;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (detail *)bVar6.data_,format_str_01,args_01);
  poVar3 = std::operator<<((ostream *)puVar1,
                           (string *)
                           &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::operator<<(poVar3,") ");
  std::__cxx11::string::~string
            ((string *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(char *)&var_decl.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x14]._M_dataplus._M_p == '\0') {
    this->indent_ = this->indent_ + 1;
  }
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             &iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(stmt->loop_body_).
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>);
  (**this->_vptr_SystemVerilogCodeGen)
            (this,iter.super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  if (*(char *)&var_decl.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x14]._M_dataplus._M_p == '\0') {
    this->indent_ = this->indent_ - 1;
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::ForStmt* stmt) {
    // for loop
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    auto iter = stmt->get_iter_var();

    // get var declaration
    std::vector<std::string> var_decl;
    if (iter->is_gen_var()) {
        // genvar don't have type declaration
        var_decl.emplace_back("genvar");
    } else {
        // maybe add support for much bigger number?
        var_decl.emplace_back("int");
        if (!iter->is_signed()) var_decl.emplace_back("unsigned");
    }

    var_decl.emplace_back(stream_.var_str(iter));
    auto var_decl_str = string::join(var_decl.begin(), var_decl.end(), " ");

    stream_ << indent() << "for (" << var_decl_str << " = ";
    stream_ << ::format("{0}", stmt->start()) << "; " << stream_.var_str(iter)
            << (stmt->end() > stmt->start() ? " < " : " > ");
    stream_ << ::format("{0}", stmt->end()) << "; " << stream_.var_str(iter)
            << (stmt->step() > 0 ? " += " : " -= ");
    stream_ << ::format("{0}", std::abs(stmt->step())) << ") ";
    if (!iter->is_gen_var()) indent_++;
    dispatch_node(stmt->get_loop_body().get());
    if (!iter->is_gen_var()) indent_--;
}